

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bug-007.cc
# Opt level: O0

int main(int param_1,char **param_2)

{
  bool bVar1;
  element_type *decl;
  ostream *this;
  undefined1 local_60 [8];
  shared_ptr<tchecker::parsing::system_declaration_t> sysdecl;
  allocator<char> local_39;
  undefined1 local_38 [8];
  string model;
  char **param_1_local;
  int param_0_local;
  
  model.field_2._8_8_ = param_2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_38,"system:foo\n",&local_39);
  std::allocator<char>::~allocator(&local_39);
  tchecker::test::parse((test *)local_60,(string *)local_38);
  bVar1 = std::operator!=((shared_ptr<tchecker::parsing::system_declaration_t> *)local_60,
                          (nullptr_t)0x0);
  if (!bVar1) {
    __assert_fail("sysdecl != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/test/bugfixes/bug-007.cc"
                  ,0xd,"int main(int, char **)");
  }
  decl = std::
         __shared_ptr_access<tchecker::parsing::system_declaration_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
         ::operator*((__shared_ptr_access<tchecker::parsing::system_declaration_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)local_60);
  this = tchecker::parsing::operator<<((ostream *)&std::cout,&decl->super_declaration_t);
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  std::shared_ptr<tchecker::parsing::system_declaration_t>::~shared_ptr
            ((shared_ptr<tchecker::parsing::system_declaration_t> *)local_60);
  std::__cxx11::string::~string((string *)local_38);
  return 0;
}

Assistant:

int main(int /*argc*/, char ** /*argv*/)
{
  std::string model = "system:foo\n";

  std::shared_ptr<tchecker::parsing::system_declaration_t> sysdecl{tchecker::test::parse(model)};

  assert(sysdecl != nullptr);
  std::cout << *sysdecl << std::endl;

  return 0;
}